

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O1

EntityExpRes __thiscall
xercesc_4_0::WFXMLScanner::scanEntityRef
          (WFXMLScanner *this,bool param_1,XMLCh *firstCh,XMLCh *secondCh,bool *escaped)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  XMLSize_t XVar1;
  XMLCh *pXVar2;
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pVVar3;
  bool bVar4;
  XMLBuffer *toFill;
  ulong uVar5;
  char16_t *pcVar6;
  EntityExpRes EVar7;
  XMLBufBid bbName;
  XMLCh expLimStr [32];
  XMLCh local_78 [36];
  
  *secondCh = L'\0';
  *escaped = false;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  XVar1 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
  bVar4 = ReaderMgr::skippedChar(this_00,L'#');
  if (bVar4) {
    bVar4 = XMLScanner::scanCharRef(&this->super_XMLScanner,firstCh,secondCh);
    EVar7 = EntityExp_Failed;
    if (bVar4) {
      *escaped = true;
      EVar7 = EntityExp_Returned;
      if (XVar1 != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
      }
    }
  }
  else {
    this_01 = &(this->super_XMLScanner).fBufMgr;
    toFill = XMLBufferMgr::bidOnBuffer(this_01);
    toFill->fIndex = 0;
    bVar4 = XMLReader::getName((this->super_XMLScanner).fReaderMgr.fCurReader,toFill,false);
    if (bVar4) {
      bVar4 = ReaderMgr::skippedChar(this_00,L';');
      if (!bVar4) {
        pXVar2 = toFill->fBuffer;
        pXVar2[toFill->fIndex] = L'\0';
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedEntityRef,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      if (XVar1 != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
      }
      pVVar3 = this->fEntityTable;
      pXVar2 = toFill->fBuffer;
      pXVar2[toFill->fIndex] = L'\0';
      bVar4 = ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey(pVVar3,pXVar2);
      if (bVar4) {
        if ((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) {
          XVar1 = (this->super_XMLScanner).fEntityExpansionLimit;
          uVar5 = (this->super_XMLScanner).fEntityExpansionCount + 1;
          (this->super_XMLScanner).fEntityExpansionCount = uVar5;
          if (XVar1 < uVar5) {
            XMLString::sizeToText(XVar1,local_78,0x1f,10,(this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,EntityExpansionLimitExceeded,local_78,(XMLCh *)0x0,
                       (XMLCh *)0x0,(XMLCh *)0x0);
            (this->super_XMLScanner).fEntityExpansionCount = 0;
          }
        }
        pVVar3 = this->fEntityTable;
        pXVar2 = toFill->fBuffer;
        pXVar2[toFill->fIndex] = L'\0';
        pcVar6 = ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                           (pVVar3,pXVar2,XMLPlatformUtils::fgMemoryManager);
        *firstCh = *pcVar6;
        *escaped = true;
        EVar7 = EntityExp_Returned;
      }
      else if (((this->super_XMLScanner).fStandalone != false) ||
              (EVar7 = EntityExp_Failed, (this->super_XMLScanner).fHasNoDTD == true)) {
        pXVar2 = toFill->fBuffer;
        pXVar2[toFill->fIndex] = L'\0';
        EVar7 = EntityExp_Failed;
        XMLScanner::emitError
                  (&this->super_XMLScanner,EntityNotFound,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
    }
    else {
      EVar7 = EntityExp_Failed;
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedEntityRefName);
    }
    XMLBufferMgr::releaseBuffer(this_01,toFill);
  }
  return EVar7;
}

Assistant:

XMLScanner::EntityExpRes
WFXMLScanner::scanEntityRef(const bool
                            ,     XMLCh&  firstCh
                            ,     XMLCh&  secondCh
                            ,     bool&   escaped)
{
    // Assume no escape
    secondCh = 0;
    escaped = false;

    // We have to insure that its all in one entity
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    //  If the next char is a pound, then its a character reference and we
    //  need to expand it always.
    if (fReaderMgr.skippedChar(chPound))
    {
        //  Its a character reference, so scan it and get back the numeric
        //  value it represents.
        if (!scanCharRef(firstCh, secondCh))
            return EntityExp_Failed;

        escaped = true;

        if (curReader != fReaderMgr.getCurrentReaderNum())
            emitError(XMLErrs::PartialMarkupInEntity);

        return EntityExp_Returned;
    }

    // Expand it since its a normal entity ref
    XMLBufBid bbName(&fBufMgr);
    if (!fReaderMgr.getName(bbName.getBuffer()))
    {
        emitError(XMLErrs::ExpectedEntityRefName);
        return EntityExp_Failed;
    }

    //  Next char must be a semi-colon. But if its not, just emit
    //  an error and try to continue.
    if (!fReaderMgr.skippedChar(chSemiColon))
        emitError(XMLErrs::UnterminatedEntityRef, bbName.getRawBuffer());

    // Make sure we ended up on the same entity reader as the & char
    if (curReader != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialMarkupInEntity);

    // Look up the name in the general entity pool
    // If it does not exist, then obviously an error
    if (!fEntityTable->containsKey(bbName.getRawBuffer()))
    {
        // XML 1.0 Section 4.1
        // Well-formedness Constraint for entity not found:
        //   In a document without any DTD, a document with only an internal DTD subset which contains no parameter entity references,
        //      or a document with "standalone='yes'", for an entity reference that does not occur within the external subset
        //      or a parameter entity
        if (fStandalone || fHasNoDTD)
            emitError(XMLErrs::EntityNotFound, bbName.getRawBuffer());

        return EntityExp_Failed;
    }

    // here's where we need to check if there's a SecurityManager,
    // how many entity references we've had
    if(fSecurityManager != 0 && ++fEntityExpansionCount > fEntityExpansionLimit) {
        XMLCh expLimStr[32];
        XMLString::sizeToText(fEntityExpansionLimit, expLimStr, 31, 10, fMemoryManager);
        emitError
        ( 
            XMLErrs::EntityExpansionLimitExceeded
            , expLimStr
        );
        // there seems nothing better to be done than to reset the entity expansion counter
        fEntityExpansionCount = 0;
    }

    firstCh = fEntityTable->get(bbName.getRawBuffer());
    escaped = true;
    return EntityExp_Returned;
}